

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

void buf2kvid(size_t chunksize,void *buf,fdb_kvs_id_t *id)

{
  ulong uVar1;
  fdb_kvs_id_t temp;
  ulong local_18;
  
  if (chunksize != 8) {
    if (chunksize < 8) {
      local_18 = 0;
      memcpy(&stack0xfffffffffffffff0 + -chunksize,buf,chunksize);
      buf = &local_18;
    }
    else {
      buf = (void *)((long)buf + (chunksize - 8));
    }
  }
  uVar1 = *buf;
  *id = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
        (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
        (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  return;
}

Assistant:

void buf2kvid(size_t chunksize, void *buf, fdb_kvs_id_t *id)
{
    size_t size_id = sizeof(fdb_kvs_id_t);
    fdb_kvs_id_t temp;

    if (chunksize == size_id) {
        temp = *((fdb_kvs_id_t*)buf);
    } else if (chunksize < size_id) {
        temp = 0;
        memcpy((uint8_t*)&temp + (size_id - chunksize), buf, chunksize);
    } else { // chunksize > sizeof(fdb_kvs_id_t)
        memcpy(&temp, (uint8_t*)buf + (chunksize - size_id), size_id);
    }
    *id = _endian_decode(temp);
}